

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O2

void de::BlockBufferBasicTest::runTest(void)

{
  int i;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  Consumer *pCVar5;
  ulong uVar6;
  size_t __n;
  int iVar7;
  uint numMessages;
  pointer ppPVar8;
  pointer ppCVar9;
  deUint32 seed;
  int iVar10;
  uint uVar11;
  uint uVar12;
  pointer ppPVar13;
  ulong uVar14;
  uint numProducers;
  bool bVar15;
  vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
  consumers;
  Message endMsg;
  undefined4 uStack_c4;
  vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
  producers;
  Random rnd;
  MessageBuffer buffer;
  
  for (seed = 0; seed != 8; seed = seed + 1) {
    deRandom_init(&rnd.m_rnd,seed);
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    numProducers = (dVar3 & 0xf) + 1;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    __n = 0x97;
    numMessages = dVar4 % 0x97 + 0x32;
    BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
              (&buffer,(dVar2 & 0xf) + 1,dVar1 % 0x7f + 2);
    producers.
    super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    producers.
    super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    producers.
    super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    consumers.
    super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    consumers.
    super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    consumers.
    super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar11 = 0; numProducers != uVar11; uVar11 = uVar11 + 1) {
      pCVar5 = (Consumer *)operator_new(0x28);
      __n = (size_t)numMessages;
      Producer::Producer((Producer *)pCVar5,&buffer,(deUint16)uVar11,numMessages);
      _endMsg = pCVar5;
      std::
      vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
      ::emplace_back<de::BlockBufferBasicTest::Producer*>
                ((vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
                  *)&producers,(Producer **)&endMsg);
    }
    uVar12 = (dVar3 & 0xf) + 1;
    uVar11 = uVar12;
    while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1,
          ppCVar9 = consumers.
                    super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, bVar15) {
      pCVar5 = (Consumer *)operator_new(0x50);
      Consumer::Consumer(pCVar5,&buffer,numProducers);
      _endMsg = pCVar5;
      std::
      vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
      ::emplace_back<de::BlockBufferBasicTest::Consumer*>
                ((vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
                  *)&consumers,(Consumer **)&endMsg);
    }
    for (; ppPVar8 = producers.
                     super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        ppCVar9 !=
        consumers.
        super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
      Thread::start(&(*ppCVar9)->super_Thread);
    }
    for (; ppPVar13 = producers.
                      super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
        ppPVar8 !=
        producers.
        super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar8 = ppPVar8 + 1) {
      Thread::start(&(*ppPVar8)->super_Thread);
    }
    for (; ppPVar13 != ppPVar8; ppPVar13 = ppPVar13 + 1) {
      Thread::join(&(*ppPVar13)->super_Thread);
      ppPVar8 = producers.
                super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    _endMsg = (Consumer *)CONCAT44(uStack_c4,0xffff0000);
    uVar11 = uVar12;
    while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1, bVar15) {
      BlockBuffer<de::BlockBufferBasicTest::Message>::write(&buffer,1,&endMsg,__n);
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::flush(&buffer);
    for (ppCVar9 = consumers.
                   super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar9 !=
        consumers.
        super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
      Thread::join(&(*ppCVar9)->super_Thread);
    }
    iVar10 = 0;
    for (uVar11 = 0; numMessages != uVar11; uVar11 = uVar11 + 1) {
      iVar10 = iVar10 + (uVar11 & 0xffff);
    }
    for (uVar14 = 0;
        ppPVar8 = producers.
                  super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar14 != numProducers;
        uVar14 = uVar14 + 1) {
      iVar7 = 0;
      for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
        iVar7 = iVar7 + (consumers.
                         super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]->m_payloadSum).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
      }
      if (iVar10 != iVar7) {
        deAssertFail("refSum == cmpSum",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deBlockBuffer.cpp"
                     ,0xd4);
      }
    }
    for (; ppCVar9 = consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        ppPVar8 !=
        producers.
        super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar8 = ppPVar8 + 1) {
      if (*ppPVar8 != (Producer *)0x0) {
        (*((*ppPVar8)->super_Thread)._vptr_Thread[1])();
      }
    }
    for (; ppCVar9 !=
           consumers.
           super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
      if (*ppCVar9 != (Consumer *)0x0) {
        (*((*ppCVar9)->super_Thread)._vptr_Thread[1])();
      }
    }
    std::
    _Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ::~_Vector_base(&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                   );
    std::
    _Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ::~_Vector_base(&producers.
                     super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                   );
    BlockBuffer<de::BlockBufferBasicTest::Message>::~BlockBuffer(&buffer);
  }
  return;
}

Assistant:

void runTest (void)
{
	const int numIterations = 8;
	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random							rnd				(iterNdx);
		int								numBlocks		= rnd.getInt(2, 128);
		int								blockSize		= rnd.getInt(1, 16);
		int								numProducers	= rnd.getInt(1, 16);
		int								numConsumers	= rnd.getInt(1, 16);
		int								dataSize		= rnd.getInt(50, 200);
		MessageBuffer					buffer			(blockSize, numBlocks);
		vector<Producer*>				producers;
		vector<Consumer*>				consumers;

		for (int i = 0; i < numProducers; i++)
			producers.push_back(new Producer(buffer, (deUint16)i, dataSize));

		for (int i = 0; i < numConsumers; i++)
			consumers.push_back(new Consumer(buffer, numProducers));

		// Start consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->start();

		// Start producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->start();

		// Wait for producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->join();

		// Write end messages for consumers.
		const Message endMsg(0xffff, 0);
		for (int i = 0; i < numConsumers; i++)
			buffer.write(1, &endMsg);
		buffer.flush();

		// Wait for consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->join();

		// Verify payload sums.
		deUint32 refSum = 0;
		for (int i = 0; i < dataSize; i++)
			refSum += (deUint32)(deUint16)i;

		for (int i = 0; i < numProducers; i++)
		{
			deUint32 cmpSum = 0;
			for (int j = 0; j < numConsumers; j++)
				cmpSum += consumers[j]->getPayloadSum((deUint16)i);
			DE_TEST_ASSERT(refSum == cmpSum);
		}

		// Free resources.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			delete *i;
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			delete *i;
	}
}